

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O3

int cs_op_count(csh ud,cs_insn *insn,uint op_type)

{
  byte bVar1;
  cs_detail *pcVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = -1;
  if (ud == 0) {
    return -1;
  }
  if (*(int *)(ud + 0xe0) != 0) {
    if (insn->id == 0) {
      *(undefined4 *)(ud + 0x58) = 0xb;
      return -1;
    }
    pcVar2 = insn->detail;
    if (pcVar2 != (cs_detail *)0x0) {
      *(undefined4 *)(ud + 0x58) = 0;
      switch(*(undefined4 *)ud) {
      case 0:
        bVar1 = (pcVar2->field_6).arm.op_count;
        if (bVar1 == 0) {
          return 0;
        }
        lVar4 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar4 + 0x42) == op_type);
          lVar4 = lVar4 + 0x28;
        } while ((ulong)bVar1 * 0x28 != lVar4);
        break;
      case 1:
        bVar1 = (pcVar2->field_6).x86.opcode[2];
        if (bVar1 == 0) {
          return 0;
        }
        lVar4 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar4 + 0x2e) == op_type);
          lVar4 = lVar4 + 0x30;
        } while ((ulong)bVar1 * 0x30 != lVar4);
        break;
      case 2:
        bVar1 = (pcVar2->field_6).x86.prefix[0];
        if (bVar1 == 0) {
          return 0;
        }
        lVar4 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar4 + 0x16) == op_type);
          lVar4 = lVar4 + 0x18;
        } while ((ulong)bVar1 * 0x18 != lVar4);
        break;
      case 3:
        bVar1 = (pcVar2->field_6).x86.op_count;
        if (bVar1 == 0) {
          return 0;
        }
        lVar4 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar4 + 0x3e) == op_type);
          lVar4 = lVar4 + 0x30;
        } while ((ulong)bVar1 * 0x30 != lVar4);
        break;
      case 4:
        bVar1 = (pcVar2->field_6).x86.addr_size;
        if (bVar1 == 0) {
          return 0;
        }
        lVar4 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar4 + 0x1a) == op_type);
          lVar4 = lVar4 + 0x10;
        } while ((ulong)bVar1 * 0x10 != lVar4);
        break;
      case 5:
        bVar1 = (pcVar2->field_6).x86.rex;
        if (bVar1 == 0) {
          return 0;
        }
        lVar4 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar4 + 0x1a) == op_type);
          lVar4 = lVar4 + 0xc;
        } while ((ulong)bVar1 * 0xc != lVar4);
        break;
      case 6:
        bVar1 = (pcVar2->field_6).x86.opcode[0];
        if (bVar1 == 0) {
          return 0;
        }
        lVar4 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar4 + 0x16) == op_type);
          lVar4 = lVar4 + 0x20;
        } while ((ulong)bVar1 * 0x20 != lVar4);
        break;
      case 7:
        bVar1 = (pcVar2->field_6).x86.prefix[0];
        if (bVar1 == 0) {
          return 0;
        }
        lVar4 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (uint)(*(uint *)(pcVar2->groups + lVar4 + 0x12) == op_type);
          lVar4 = lVar4 + 0x10;
        } while ((ulong)bVar1 * 0x10 != lVar4);
        break;
      default:
        *(undefined4 *)(ud + 0x58) = 3;
      }
      return iVar3;
    }
  }
  *(undefined4 *)(ud + 0x58) = 7;
  return -1;
}

Assistant:

CAPSTONE_EXPORT
int cs_op_count(csh ud, const cs_insn *insn, unsigned int op_type)
{
	struct cs_struct *handle;
	unsigned int count = 0, i;
	if (!ud)
		return -1;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	if(!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return -1;
	}

	if(!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return -1;
	}

	handle->errnum = CS_ERR_OK;

	switch (handle->arch) {
		default:
			handle->errnum = CS_ERR_HANDLE;
			return -1;
		case CS_ARCH_ARM:
			for (i = 0; i < insn->detail->arm.op_count; i++)
				if (insn->detail->arm.operands[i].type == (arm_op_type)op_type)
					count++;
			break;
		case CS_ARCH_ARM64:
			for (i = 0; i < insn->detail->arm64.op_count; i++)
				if (insn->detail->arm64.operands[i].type == (arm64_op_type)op_type)
					count++;
			break;
		case CS_ARCH_X86:
			for (i = 0; i < insn->detail->x86.op_count; i++)
				if (insn->detail->x86.operands[i].type == (x86_op_type)op_type)
					count++;
			break;
		case CS_ARCH_MIPS:
			for (i = 0; i < insn->detail->mips.op_count; i++)
				if (insn->detail->mips.operands[i].type == (mips_op_type)op_type)
					count++;
			break;
		case CS_ARCH_PPC:
			for (i = 0; i < insn->detail->ppc.op_count; i++)
				if (insn->detail->ppc.operands[i].type == (ppc_op_type)op_type)
					count++;
			break;
		case CS_ARCH_SPARC:
			for (i = 0; i < insn->detail->sparc.op_count; i++)
				if (insn->detail->sparc.operands[i].type == (sparc_op_type)op_type)
					count++;
			break;
		case CS_ARCH_SYSZ:
			for (i = 0; i < insn->detail->sysz.op_count; i++)
				if (insn->detail->sysz.operands[i].type == (sysz_op_type)op_type)
					count++;
			break;
		case CS_ARCH_XCORE:
			for (i = 0; i < insn->detail->xcore.op_count; i++)
				if (insn->detail->xcore.operands[i].type == (xcore_op_type)op_type)
					count++;
			break;
	}

	return count;
}